

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O2

int ffukls(fitsfile *fptr,char *keyname,char *value,char *comm,int *status)

{
  int iVar1;
  int iVar2;
  char junk [81];
  char acStack_88 [88];
  
  iVar2 = *status;
  if (iVar2 < 1) {
    iVar1 = ffmkls(fptr,keyname,value,comm,status);
    if (iVar1 == 0xca) {
      ffgmsg(acStack_88);
      *status = iVar2;
      ffpkls(fptr,keyname,value,comm,status);
    }
    iVar2 = *status;
  }
  return iVar2;
}

Assistant:

int ffukls(fitsfile *fptr,      /* I - FITS file pointer  */
           const char *keyname, /* I - keyword name       */
           const char *value,   /* I - keyword value      */
           const char *comm,    /* I - keyword comment    */
           int *status)         /* IO - error status      */ 
{
    /* update a long string keyword */

    int tstatus;
    char junk[FLEN_ERRMSG];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    tstatus = *status;

    if (ffmkls(fptr, keyname, value, comm, status) == KEY_NO_EXIST)
    {
        /* since the ffmkls call failed, it wrote a bogus error message */
        fits_read_errmsg(junk);  /* clear the error message */
	
        *status = tstatus;
        ffpkls(fptr, keyname, value, comm, status);
    }
    return(*status);
}